

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_entropy_loss.cc
# Opt level: O2

void __thiscall
xLearn::CrossEntropyLoss::CalcGrad(CrossEntropyLoss *this,DMatrix *matrix,Model *model)

{
  index_t *piVar1;
  ostream *poVar2;
  size_type sVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_type __n;
  long lVar7;
  real_t rVar8;
  allocator local_ba;
  allocator local_b9;
  Logger local_b8;
  uint local_b4;
  vector<float,_std::allocator<float>_> sum;
  string local_90;
  Score *local_70;
  Model *local_68;
  DMatrix *local_60;
  ulong local_58;
  DMatrix *local_50;
  Model *local_48;
  
  local_48 = model;
  if (matrix == (DMatrix *)0x0) {
    local_b8.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/cross_entropy_loss.cc"
               ,&local_b9);
    std::__cxx11::string::string((string *)&sum,"CalcGrad",&local_ba);
    poVar2 = Logger::Start(ERR,&local_90,0x77,(string *)&sum);
    poVar2 = std::operator<<(poVar2,"CHECK failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/cross_entropy_loss.cc"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x77);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"matrix");
    std::operator<<(poVar2," == NULL \n");
  }
  else {
    local_58 = (ulong)matrix->row_length;
    if (local_58 != 0) {
      piVar1 = &(this->super_Loss).total_example_;
      *piVar1 = *piVar1 + matrix->row_length;
      if ((this->super_Loss).lock_free_ == false) {
        uVar4 = 1;
      }
      else {
        uVar4 = (uint)(this->super_Loss).threadNumber_;
      }
      __n = (size_type)(int)uVar4;
      local_90._M_dataplus._M_p = local_90._M_dataplus._M_p & 0xffffffff00000000;
      local_50 = matrix;
      std::vector<float,_std::allocator<float>_>::vector
                (&sum,__n,(value_type_conflict *)&local_90,(allocator_type *)&local_b8);
      iVar6 = 0;
      sVar3 = __n;
      local_b4 = uVar4;
      for (lVar7 = 0; sVar3 = sVar3 - 1, (ulong)(~((int)uVar4 >> 0x1f) & uVar4) << 2 != lVar7;
          lVar7 = lVar7 + 4) {
        local_90._M_string_length._4_4_ = (int)(local_58 / __n);
        iVar5 = (iVar6 + 1) * local_90._M_string_length._4_4_;
        local_90._M_string_length._4_4_ = iVar6 * local_90._M_string_length._4_4_;
        local_90._M_string_length._0_4_ = (int)(local_58 % __n) + iVar5;
        if (sVar3 != 0) {
          local_90._M_string_length._0_4_ = iVar5;
        }
        local_90._M_dataplus._M_p = (pointer)ce_gradient_thread;
        local_90.field_2._M_allocated_capacity =
             (long)sum.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar7;
        local_90.field_2._M_local_buf[8] = (this->super_Loss).norm_;
        local_70 = (this->super_Loss).score_func_;
        local_68 = local_48;
        local_60 = local_50;
        ThreadPool::
        enqueue<std::_Bind<void(*(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_int,unsigned_int))(xLearn::DMatrix_const*,xLearn::Model*,xLearn::Score*,bool,float*,unsigned_long,unsigned_long)>>
                  ((ThreadPool *)&stack0xffffffffffffffc0,
                   (_Bind<void_(*(const_xLearn::DMatrix_*,_xLearn::Model_*,_xLearn::Score_*,_bool,_float_*,_unsigned_int,_unsigned_int))(const_xLearn::DMatrix_*,_xLearn::Model_*,_xLearn::Score_*,_bool,_float_*,_unsigned_long,_unsigned_long)>
                    *)(this->super_Loss).pool_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
        iVar6 = iVar6 + 1;
      }
      ThreadPool::Sync((this->super_Loss).pool_,local_b4);
      rVar8 = (this->super_Loss).loss_sum_;
      for (lVar7 = 0;
          (long)sum.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)sum.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 != lVar7; lVar7 = lVar7 + 1) {
        rVar8 = rVar8 + sum.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar7];
        (this->super_Loss).loss_sum_ = rVar8;
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&sum.super__Vector_base<float,_std::allocator<float>_>);
      return;
    }
    local_b8.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/cross_entropy_loss.cc"
               ,&local_b9);
    std::__cxx11::string::string((string *)&sum,"CalcGrad",&local_ba);
    poVar2 = Logger::Start(ERR,&local_90,0x78,(string *)&sum);
    poVar2 = std::operator<<(poVar2,"CHECK_GT failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/loss/cross_entropy_loss.cc"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x78);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"matrix->row_length");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"0");
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::string::~string((string *)&sum);
  std::__cxx11::string::~string((string *)&local_90);
  Logger::~Logger(&local_b8);
  abort();
}

Assistant:

void CrossEntropyLoss::CalcGrad(const DMatrix* matrix,
                                Model& model) {
  CHECK_NOTNULL(matrix);
  CHECK_GT(matrix->row_length, 0);
  size_t row_len = matrix->row_length;
  total_example_ += row_len;
  // multi-thread training
  int count = lock_free_ ? threadNumber_ : 1;
  std::vector<real_t> sum(count, 0);
  for (int i = 0; i < count; ++i) {
    index_t start_idx = getStart(row_len, count, i);
    index_t end_idx = getEnd(row_len, count, i);
    pool_->enqueue(std::bind(ce_gradient_thread,
                             matrix,
                             &model,
                             score_func_,
                             norm_,
                             &(sum[i]),
                             start_idx,
                             end_idx));
  }
  // Wait all of the threads finish their job
  pool_->Sync(count);
  // Accumulate loss
  for (int i = 0; i < sum.size(); ++i) {
    loss_sum_ += sum[i];
  }
}